

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_framework.cpp
# Opt level: O0

void __thiscall
PerformanceTestFramework::add(PerformanceTestFramework *this,testFunction test,string *name)

{
  pair<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  _func_pair<double,_double> **in_stack_ffffffffffffff78;
  pair<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__x;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  pair<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  __x = &local_40;
  std::
  pair<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_RDI,in_stack_ffffffffffffff78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x16f0df);
  std::
  map<std::pair<double,double>(*)(),std::__cxx11::string,std::less<std::pair<double,double>(*)()>,std::allocator<std::pair<std::pair<double,double>(*const)(),std::__cxx11::string>>>
  ::insert<std::pair<std::pair<double,double>(*)(),std::__cxx11::string>>
            ((map<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<double,_double>_(*)()>,_std::allocator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),__x);
  std::
  pair<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x16f115);
  return;
}

Assistant:

void PerformanceTestFramework::add( const testFunction test, const std::string & name )
{
    _performanceTest.insert( std::pair < testFunction, std::string > ( test, name ) );
}